

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O1

tuple<int,_int> __thiscall
libtorrent::aux::http_parser::incoming(http_parser *this,span<const_char> recv_buffer,bool *error)

{
  string *this_00;
  pointer *pppVar1;
  bool *pbVar2;
  int iVar3;
  size_type sVar4;
  pointer pcVar5;
  long lVar6;
  iterator __position;
  _Alloc_hider _Var7;
  char cVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  bool *pbVar12;
  long lVar13;
  int iVar14;
  bool *pbVar15;
  int iVar16;
  char *pcVar17;
  _Alloc_hider __nptr;
  http_parser *this_01;
  bool *in_R8;
  bool *pbVar18;
  size_type sVar19;
  ulong uVar20;
  int iVar21;
  bool *pbVar22;
  span<const_char> buf;
  char *line;
  char *end;
  string name;
  string value;
  bool *local_128;
  bool *local_108;
  char *local_100;
  bool local_f8;
  undefined7 uStack_f7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_a8;
  char *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  bool *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  bool *local_48;
  string *local_40;
  string *local_38;
  
  local_a0 = (char *)recv_buffer.m_len;
  this_01 = (http_parser *)recv_buffer.m_ptr;
  this->m_recv_pos = 0;
  local_128 = (bool *)(this_01->m_recv_buffer).m_len;
  if (local_128 != error) {
    (this_01->m_recv_buffer).m_ptr = local_a0;
    (this_01->m_recv_buffer).m_len = (difference_type)error;
    if (this_01->m_state == error_state) {
      *in_R8 = true;
    }
    else {
      pbVar22 = (bool *)(local_a0 + this_01->m_recv_pos);
      pbVar2 = error + (long)local_a0;
      this_00 = &this_01->m_protocol;
      local_38 = (string *)&this_01->m_method;
      local_40 = (string *)&this_01->m_path;
      local_50 = (string *)&this_01->m_server_message;
      local_a8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&this_01->m_header;
      pbVar18 = in_R8;
      local_78 = error;
      do {
        if (this_01->m_state == read_status) {
          local_e8.first._M_dataplus._M_p._0_1_ = 10;
          pbVar12 = (bool *)::std::
                            __find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                      (pbVar22,pbVar2,&local_e8);
          if (pbVar12 == pbVar2) {
            *(int *)&this->m_recv_pos =
                 (int)this->m_recv_pos + ((int)(this_01->m_recv_buffer).m_len - (int)local_128);
LAB_00210d65:
            bVar10 = false;
          }
          else {
            if (pbVar12 == pbVar22) {
              this_01->m_state = error_state;
              *in_R8 = true;
              goto LAB_00210d65;
            }
            pbVar15 = pbVar12 + -1;
            if (pbVar12[-1] != true) {
              pbVar15 = pbVar12;
            }
            pbVar12 = pbVar12 + 1;
            this_01->m_recv_pos = this_01->m_recv_pos + (long)((int)pbVar12 - (int)pbVar22);
            *(int *)&this->m_recv_pos =
                 (int)this->m_recv_pos +
                 ((int)pbVar12 - ((int)local_128 + *(int *)&(this_01->m_recv_buffer).m_ptr));
            cVar9 = (char)pbVar15;
            local_108 = pbVar22;
            read_until_abi_cxx11_
                      (&local_e8.first,(libtorrent *)&local_108,(char **)&DAT_00000020,cVar9,pbVar18
                      );
            ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
              operator_delete(local_e8.first._M_dataplus._M_p,
                              local_e8.first.field_2._M_allocated_capacity + 1);
            }
            ::std::__cxx11::string::substr((ulong)&local_e8,(ulong)this_00);
            iVar11 = ::std::__cxx11::string::compare((char *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
              operator_delete(local_e8.first._M_dataplus._M_p,
                              local_e8.first.field_2._M_allocated_capacity + 1);
            }
            if (iVar11 == 0) {
              read_until_abi_cxx11_
                        (&local_e8.first,(libtorrent *)&local_108,(char **)&DAT_00000020,cVar9,
                         pbVar18);
              _Var7._M_p = local_e8.first._M_dataplus._M_p;
              iVar11 = atoi(local_e8.first._M_dataplus._M_p);
              this_01->m_status_code = iVar11;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var7._M_p != &local_e8.first.field_2) {
                operator_delete(_Var7._M_p,local_e8.first.field_2._M_allocated_capacity + 1);
              }
              read_until_abi_cxx11_
                        (&local_e8.first,(libtorrent *)&local_108,(char **)0xd,cVar9,pbVar18);
              ::std::__cxx11::string::operator=(local_50,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
                operator_delete(local_e8.first._M_dataplus._M_p,
                                local_e8.first.field_2._M_allocated_capacity + 1);
              }
              iVar11 = ::std::__cxx11::string::compare((char *)this_00);
              if (iVar11 == 0) {
                this_01->m_connection_close = true;
              }
            }
            else {
              local_48 = pbVar12;
              ::std::__cxx11::string::_M_assign(local_38);
              sVar4 = (this_01->m_method)._M_string_length;
              if (sVar4 != 0) {
                pcVar5 = (this_01->m_method)._M_dataplus._M_p;
                sVar19 = 0;
                do {
                  cVar8 = to_lower(pcVar5[sVar19]);
                  pcVar5[sVar19] = cVar8;
                  sVar19 = sVar19 + 1;
                } while (sVar4 != sVar19);
              }
              this_01->m_content_length = 0;
              (this_01->m_protocol)._M_string_length = 0;
              *(this_01->m_protocol)._M_dataplus._M_p = '\0';
              read_until_abi_cxx11_
                        (&local_e8.first,(libtorrent *)&local_108,(char **)&DAT_00000020,cVar9,
                         pbVar18);
              ::std::__cxx11::string::operator=(local_40,(string *)&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
                operator_delete(local_e8.first._M_dataplus._M_p,
                                local_e8.first.field_2._M_allocated_capacity + 1);
              }
              read_until_abi_cxx11_
                        (&local_e8.first,(libtorrent *)&local_108,(char **)&DAT_00000020,cVar9,
                         pbVar18);
              ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_e8);
              pbVar12 = local_48;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
                operator_delete(local_e8.first._M_dataplus._M_p,
                                local_e8.first.field_2._M_allocated_capacity + 1);
              }
              this_01->m_status_code = 0;
            }
            this_01->m_state = read_header;
            local_128 = pbVar12 + -(long)local_a0;
            bVar10 = true;
            pbVar22 = pbVar12;
          }
          if (!bVar10) {
            return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
          }
        }
        if (this_01->m_state != read_header) goto LAB_002112ff;
        local_e8.first._M_dataplus._M_p._0_1_ = 10;
        pbVar12 = (bool *)::std::
                          __find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                    (pbVar22,pbVar2,&local_e8);
        local_108 = &local_f8;
        local_100 = (char *)0x0;
        local_f8 = false;
        pbVar15 = pbVar22;
        do {
          pbVar22 = pbVar15;
          if ((pbVar12 == pbVar2) || (this_01->m_state != read_header)) goto LAB_0021129f;
          pbVar18 = pbVar12;
          if ((pbVar15 != pbVar12) && (pbVar18 = pbVar12 + -1, pbVar12[-1] != true)) {
            pbVar18 = pbVar12;
          }
          pbVar18 = pbVar18 + -(long)pbVar15;
          ::std::__cxx11::string::replace((ulong)&local_108,0,local_100,(ulong)pbVar15);
          pbVar22 = pbVar12 + 1;
          this_01->m_recv_pos = (int64_t)(pbVar22 + (this_01->m_recv_pos - (long)pbVar15));
          lVar13 = ::std::__cxx11::string::find((char)&local_108,0x3a);
          pbVar12 = pbVar22;
          if (lVar13 == -1) {
            if (this_01->m_status_code == 100) {
              this_01->m_state = read_status;
              iVar11 = 4;
            }
            else {
              this_01->m_state = read_body;
              this_01->m_body_start_pos = (int)this_01->m_recv_pos;
              iVar11 = 0x10;
            }
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_108);
            sVar4 = local_98._M_string_length;
            if (local_98._M_string_length != 0) {
              lVar6 = CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p);
              sVar19 = 0;
              do {
                cVar9 = to_lower(*(char *)(lVar6 + sVar19));
                *(char *)(lVar6 + sVar19) = cVar9;
                sVar19 = sVar19 + 1;
              } while (sVar4 != sVar19);
            }
            pcVar17 = (char *)(lVar13 + 1);
            if (pcVar17 < local_100) {
              do {
                if ((local_108[(long)pcVar17] != true) && (local_108[(long)pcVar17] != true)) break;
                pcVar17 = pcVar17 + 1;
              } while (local_100 != pcVar17);
            }
            ::std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_108);
            ::std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      (&local_e8,&local_98,&local_70);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      (local_a8,&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.second._M_dataplus._M_p != &local_e8.second.field_2) {
              operator_delete(local_e8.second._M_dataplus._M_p,
                              local_e8.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
              operator_delete(local_e8.first._M_dataplus._M_p,
                              local_e8.first.field_2._M_allocated_capacity + 1);
            }
            iVar11 = ::std::__cxx11::string::compare((char *)&local_98);
            if (iVar11 == 0) {
              uVar20 = strtoll(local_70._M_dataplus._M_p,(char **)0x0,10);
              this_01->m_content_length = uVar20;
              if (uVar20 < 0x7fffffffffffffff) goto LAB_00211146;
              this_01->m_state = error_state;
              *in_R8 = true;
              iVar11 = 1;
            }
            else {
              iVar11 = ::std::__cxx11::string::compare((char *)&local_98);
              if (iVar11 == 0) {
                bVar10 = string_begins_no_case("close",local_70._M_dataplus._M_p);
                this_01->m_connection_close = bVar10;
              }
              else {
                iVar11 = ::std::__cxx11::string::compare((char *)&local_98);
                _Var7._M_p = local_70._M_dataplus._M_p;
                if (iVar11 == 0) {
                  bVar10 = string_begins_no_case("bytes ",local_70._M_dataplus._M_p);
                  __nptr._M_p = _Var7._M_p + 6;
                  if (!bVar10) {
                    __nptr._M_p = _Var7._M_p;
                  }
                  uVar20 = strtoll(__nptr._M_p,(char **)&local_e8,10);
                  this_01->m_range_start = uVar20;
                  if (((uVar20 < 0x7fffffffffffffff) &&
                      (local_e8.first._M_dataplus._M_p != __nptr._M_p)) &&
                     (*local_e8.first._M_dataplus._M_p == '-')) {
                    pcVar17 = local_e8.first._M_dataplus._M_p + 1;
                    uVar20 = strtoll(pcVar17,(char **)&local_e8,10);
                    this_01->m_range_end = uVar20;
                    if (((uVar20 < 0x7fffffffffffffff) &&
                        (local_e8.first._M_dataplus._M_p != pcVar17)) &&
                       (this_01->m_range_start <= (long)uVar20)) {
                      this_01->m_content_length = (uVar20 - this_01->m_range_start) + 1;
                      goto LAB_00211146;
                    }
                  }
                  this_01->m_state = error_state;
                  *in_R8 = true;
                  iVar11 = 1;
                  goto LAB_0021115f;
                }
                iVar11 = ::std::__cxx11::string::compare((char *)&local_98);
                if (iVar11 == 0) {
                  bVar10 = string_begins_no_case("chunked",local_70._M_dataplus._M_p);
                  this_01->m_chunked_encoding = bVar10;
                }
              }
LAB_00211146:
              local_e8.first._M_dataplus._M_p._0_1_ = 10;
              pbVar12 = (bool *)::std::
                                __find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                          (pbVar22,pbVar2,&local_e8);
              iVar11 = 0;
            }
LAB_0021115f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p) !=
                &local_98.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_98._M_dataplus._M_p._4_4_,
                                       (int)local_98._M_dataplus._M_p),
                              local_98.field_2._M_allocated_capacity + 1);
            }
          }
          pbVar15 = pbVar22;
        } while (iVar11 == 0);
        if (iVar11 == 0x10) {
LAB_0021129f:
          *(int *)&this->m_recv_pos =
               (int)this->m_recv_pos +
               ((int)pbVar12 - (*(int *)&(this_01->m_recv_buffer).m_ptr + (int)local_128));
          iVar11 = 0;
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,CONCAT71(uStack_f7,local_f8) + 1);
        }
      } while (iVar11 == 4);
      if (iVar11 == 0) {
LAB_002112ff:
        if (this_01->m_state == read_body) {
          uVar20 = (long)pbVar2 - (long)pbVar22;
          if ((this_01->m_chunked_encoding == true) && ((this_01->m_flags & 1) == 0)) {
            if (this_01->m_cur_chunk_end == -1) {
              this_01->m_cur_chunk_end = (long)this_01->m_body_start_pos;
            }
            iVar21 = (int)this->m_recv_pos;
            iVar16 = *(int *)((long)&this->m_recv_pos + 4);
            do {
              lVar13 = this_01->m_recv_pos;
              lVar6 = this_01->m_cur_chunk_end;
              iVar11 = (int)uVar20;
              if (((iVar11 + lVar13 < lVar6) || (iVar11 < 1)) || (this_01->m_finished != false)) {
                *(int *)((long)&this->m_recv_pos + 4) = iVar16;
                *(int *)&this->m_recv_pos = iVar21;
                if (iVar11 < 1) goto LAB_00211571;
                this_01->m_recv_pos = iVar11 + lVar13;
                goto LAB_00211569;
              }
              if (lVar6 - lVar13 != 0 && lVar13 <= lVar6) {
                this_01->m_recv_pos = lVar6;
                iVar14 = (int)(lVar6 - lVar13);
                iVar16 = iVar16 + iVar14;
                uVar20 = (ulong)(uint)(iVar11 - iVar14);
              }
              buf.m_len = (long)local_78 - lVar6;
              buf.m_ptr = local_a0 + lVar6;
              bVar10 = parse_chunk_header(this_01,buf,(int64_t *)&local_108,(int *)&local_98);
              iVar11 = (int)local_98._M_dataplus._M_p;
              pbVar2 = local_108;
              iVar14 = (int)uVar20;
              if (bVar10) {
                local_a8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,libtorrent::aux::strview_less,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)CONCAT44(local_a8._4_4_,iVar21);
                if (-1 < (long)local_108) {
                  lVar13 = (long)(int)local_98._M_dataplus._M_p;
                  pcVar17 = (char *)(this_01->m_cur_chunk_end + lVar13);
                  if ((long)local_108 <= 0x7fffffffffffffff - (long)pcVar17) {
                    if (local_108 != (bool *)0x0) {
                      local_e8.first._M_string_length = (size_type)(pcVar17 + (long)local_108);
                      __position._M_current =
                           (this_01->m_chunked_ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      local_e8.first._M_dataplus._M_p = pcVar17;
                      if (__position._M_current ==
                          (this_01->m_chunked_ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                        _M_realloc_insert<std::pair<long,long>const&>
                                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>
                                    *)&this_01->m_chunked_ranges,__position,
                                   (pair<long,_long> *)&local_e8);
                      }
                      else {
                        (__position._M_current)->first = (long)pcVar17;
                        (__position._M_current)->second = local_e8.first._M_string_length;
                        pppVar1 = &(this_01->m_chunked_ranges).
                                   super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *pppVar1 = *pppVar1 + 1;
                      }
                    }
                    this_01->m_cur_chunk_end = (int64_t)(pbVar2 + this_01->m_cur_chunk_end + lVar13)
                    ;
                    if (pbVar2 == (bool *)0x0) {
                      this_01->m_finished = true;
                    }
                    iVar3 = this_01->m_partial_chunk_header;
                    this_01->m_partial_chunk_header = 0;
                    iVar21 = (int)local_a8;
                    local_98._M_dataplus._M_p._0_4_ = iVar11 - iVar3;
                    goto LAB_002114fa;
                  }
                }
                this_01->m_state = error_state;
                *in_R8 = true;
                bVar10 = false;
              }
              else {
                this_01->m_partial_chunk_header = this_01->m_partial_chunk_header + iVar14;
                local_98._M_dataplus._M_p._0_4_ = iVar14;
LAB_002114fa:
                this_01->m_chunk_header_size =
                     this_01->m_chunk_header_size + (int)local_98._M_dataplus._M_p;
                this_01->m_recv_pos = this_01->m_recv_pos + (long)(int)local_98._M_dataplus._M_p;
                iVar21 = iVar21 + (int)local_98._M_dataplus._M_p;
                uVar20 = (ulong)(uint)(iVar14 - (int)local_98._M_dataplus._M_p);
                bVar10 = true;
              }
            } while (bVar10);
            *(int *)((long)&this->m_recv_pos + 4) = iVar16;
            *(int *)&this->m_recv_pos = iVar21;
          }
          else {
            iVar21 = (int)uVar20;
            lVar13 = this_01->m_recv_pos;
            lVar6 = this_01->m_content_length;
            iVar11 = ((int)lVar6 - (int)lVar13) + this_01->m_body_start_pos;
            if ((iVar21 + lVar13) - (long)this_01->m_body_start_pos <= lVar6) {
              iVar11 = iVar21;
            }
            if (lVar6 < 0) {
              iVar11 = iVar21;
            }
            this_01->m_recv_pos = lVar13 + iVar11;
LAB_00211569:
            *(int *)((long)&this->m_recv_pos + 4) = iVar11 + *(int *)((long)&this->m_recv_pos + 4);
LAB_00211571:
            if (((-1 < this_01->m_content_length) && (this_01->m_chunked_encoding == false)) &&
               (this_01->m_content_length <= this_01->m_recv_pos - (long)this_01->m_body_start_pos))
            {
              this_01->m_finished = true;
            }
          }
        }
      }
    }
  }
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

std::tuple<int, int> http_parser::incoming(
		span<char const> recv_buffer, bool& error)
	{
		TORRENT_ASSERT(recv_buffer.size() >= m_recv_buffer.size());
		std::tuple<int, int> ret(0, 0);
		std::ptrdiff_t start_pos = m_recv_buffer.size();

		// early exit if there's nothing new in the receive buffer
		if (start_pos == recv_buffer.size()) return ret;
		m_recv_buffer = recv_buffer;

		if (m_state == error_state)
		{
			error = true;
			return ret;
		}

		char const* pos = recv_buffer.data() + m_recv_pos;

restart_response:

		if (m_state == read_status)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			// if we don't have a full line yet, wait.
			if (newline == recv_buffer.end())
			{
				std::get<1>(ret) += int(m_recv_buffer.size() - start_pos);
				return ret;
			}

			if (newline == pos)
			{
				m_state = error_state;
				error = true;
				return ret;
			}

			char const* line_end = newline;
			if (pos != line_end && *(line_end - 1) == '\r') --line_end;

			char const* line = pos;
			++newline;
			TORRENT_ASSERT(newline >= pos);
			int incoming = int(newline - pos);
			m_recv_pos += incoming;
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
			pos = newline;

			m_protocol = read_until(line, ' ', line_end);
			if (m_protocol.substr(0, 5) == "HTTP/")
			{
				m_status_code = atoi(read_until(line, ' ', line_end).c_str());
				m_server_message = read_until(line, '\r', line_end);

				// HTTP 1.0 always closes the connection after
				// each request
				if (m_protocol == "HTTP/1.0") m_connection_close = true;
			}
			else
			{
				m_method = m_protocol;
				std::transform(m_method.begin(), m_method.end(), m_method.begin(), &to_lower);
				// the content length is assumed to be 0 for requests
				m_content_length = 0;
				m_protocol.clear();
				m_path = read_until(line, ' ', line_end);
				m_protocol = read_until(line, ' ', line_end);
				m_status_code = 0;
			}
			m_state = read_header;
			start_pos = pos - recv_buffer.data();
		}

		if (m_state == read_header)
		{
			TORRENT_ASSERT(!m_finished);
			TORRENT_ASSERT(pos <= recv_buffer.end());
			char const* newline = std::find(pos, recv_buffer.end(), '\n');
			std::string line;

			while (newline != recv_buffer.end() && m_state == read_header)
			{
				// if the LF character is preceded by a CR
				// character, don't copy it into the line string.
				char const* line_end = newline;
				if (pos != line_end && *(line_end - 1) == '\r') --line_end;
				line.assign(pos, line_end);
				++newline;
				m_recv_pos += newline - pos;
				pos = newline;

				std::string::size_type separator = line.find(':');
				if (separator == std::string::npos)
				{
					if (m_status_code == 100)
					{
						// for 100 Continue, we need to read another response header
						// before reading the body
						m_state = read_status;
						goto restart_response;
					}
					// this means we got a blank line,
					// the header is finished and the body
					// starts.
					m_state = read_body;
					// if this is a request (not a response)
					// we're done once we reach the end of the headers
//					if (!m_method.empty()) m_finished = true;
					// the HTTP header should always be < 2 GB
					TORRENT_ASSERT(m_recv_pos < std::numeric_limits<int>::max());
					m_body_start_pos = int(m_recv_pos);
					break;
				}

				std::string name = line.substr(0, separator);
				std::transform(name.begin(), name.end(), name.begin(), &to_lower);
				++separator;
				// skip whitespace
				while (separator < line.size()
					&& (line[separator] == ' ' || line[separator] == '\t'))
					++separator;
				std::string value = line.substr(separator, std::string::npos);
				m_header.insert(std::make_pair(name, value));

				if (name == "content-length")
				{
					m_content_length = std::strtoll(value.c_str(), nullptr, 10);
					if (m_content_length < 0
						|| m_content_length == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
				}
				else if (name == "connection")
				{
					m_connection_close = string_begins_no_case("close", value.c_str());
				}
				else if (name == "content-range")
				{
					bool success = true;
					char const* ptr = value.c_str();

					// apparently some web servers do not send the "bytes"
					// in their content-range. Don't treat it as an error
					// if we can't find it, just assume the byte counters
					// start immediately
					if (string_begins_no_case("bytes ", ptr)) ptr += 6;
					char* end;
					m_range_start = std::strtoll(ptr, &end, 10);
					if (m_range_start < 0
						|| m_range_start == std::numeric_limits<std::int64_t>::max())
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					if (end == ptr) success = false;
					else if (*end != '-') success = false;
					else
					{
						ptr = end + 1;
						m_range_end = std::strtoll(ptr, &end, 10);
						if (m_range_end < 0
							|| m_range_end == std::numeric_limits<std::int64_t>::max())
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (end == ptr) success = false;
					}

					if (!success || m_range_end < m_range_start)
					{
						m_state = error_state;
						error = true;
						return ret;
					}
					// the http range is inclusive
					m_content_length = m_range_end - m_range_start + 1;
				}
				else if (name == "transfer-encoding")
				{
					m_chunked_encoding = string_begins_no_case("chunked", value.c_str());
				}

				TORRENT_ASSERT(m_recv_pos <= int(recv_buffer.size()));
				TORRENT_ASSERT(pos <= recv_buffer.end());
				newline = std::find(pos, recv_buffer.end(), '\n');
			}
			std::get<1>(ret) += int(newline - (m_recv_buffer.data() + start_pos));
		}

		if (m_state == read_body)
		{
			int incoming = int(recv_buffer.end() - pos);

			if (m_chunked_encoding && (m_flags & dont_parse_chunks) == 0)
			{
				if (m_cur_chunk_end == -1)
					m_cur_chunk_end = m_body_start_pos;

				while (m_cur_chunk_end <= m_recv_pos + incoming && !m_finished && incoming > 0)
				{
					std::int64_t payload = m_cur_chunk_end - m_recv_pos;
					if (payload > 0)
					{
						TORRENT_ASSERT(payload < std::numeric_limits<int>::max());
						m_recv_pos += payload;
						std::get<0>(ret) += int(payload);
						incoming -= int(payload);
					}
					auto const buf = span<char const>(recv_buffer)
						.subspan(aux::numeric_cast<std::ptrdiff_t>(m_cur_chunk_end));
					std::int64_t chunk_size;
					int header_size;
					if (parse_chunk_header(buf, &chunk_size, &header_size))
					{
						if (chunk_size < 0
							|| chunk_size > std::numeric_limits<std::int64_t>::max() - m_cur_chunk_end - header_size)
						{
							m_state = error_state;
							error = true;
							return ret;
						}
						if (chunk_size > 0)
						{
							std::pair<std::int64_t, std::int64_t> chunk_range(m_cur_chunk_end + header_size
								, m_cur_chunk_end + header_size + chunk_size);
							m_chunked_ranges.push_back(chunk_range);
						}
						m_cur_chunk_end += header_size + chunk_size;
						if (chunk_size == 0)
						{
							m_finished = true;
						}
						header_size -= m_partial_chunk_header;
						m_partial_chunk_header = 0;
//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 1, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					else
					{
						m_partial_chunk_header += incoming;
						header_size = incoming;

//						std::fprintf(stderr, "parse_chunk_header(%d, -> %" PRId64 ", -> %d) -> %d\n"
//							"  incoming = %d\n  m_recv_pos = %d\n  m_cur_chunk_end = %" PRId64 "\n"
//							"  content-length = %d\n"
//							, int(buf.size()), chunk_size, header_size, 0, incoming, int(m_recv_pos)
//							, m_cur_chunk_end, int(m_content_length));
					}
					m_chunk_header_size += header_size;
					m_recv_pos += header_size;
					std::get<1>(ret) += header_size;
					incoming -= header_size;
				}
				if (incoming > 0)
				{
					m_recv_pos += incoming;
					std::get<0>(ret) += incoming;
//					incoming = 0;
				}
			}
			else
			{
				std::int64_t payload_received = m_recv_pos - m_body_start_pos + incoming;
				if (payload_received > m_content_length
					&& m_content_length >= 0)
				{
					TORRENT_ASSERT(m_content_length - m_recv_pos + m_body_start_pos
						< std::numeric_limits<int>::max());
					incoming = int(m_content_length - m_recv_pos + m_body_start_pos);
				}

				TORRENT_ASSERT(incoming >= 0);
				m_recv_pos += incoming;
				std::get<0>(ret) += incoming;
			}

			if (m_content_length >= 0
				&& !m_chunked_encoding
				&& m_recv_pos - m_body_start_pos >= m_content_length)
			{
				m_finished = true;
			}
		}
		return ret;
	}